

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
LookupPred<ot::commissioner::persistent_storage::Network>
          (PersistentStorageJson *this,
          function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *aPred,
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          *aRet,string *aArrName)

{
  reference pvVar1;
  size_type sVar2;
  function<bool_(const_ot::commissioner::persistent_storage::Network_&)> local_a0;
  back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_80;
  iterator local_78;
  iterator local_58;
  size_type local_38;
  size_t prevSize;
  string *aArrName_local;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  *aRet_local;
  function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *aPred_local;
  PersistentStorageJson *this_local;
  
  prevSize = (size_t)aArrName;
  aArrName_local = (string *)aRet;
  aRet_local = (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                *)aPred;
  aPred_local = (function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)this;
  local_38 = std::
             vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ::size(aRet);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  std::
  begin<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_58,pvVar1);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](&this->mCache,aArrName);
  std::
  end<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (&local_78,pvVar1);
  local_80 = std::
             back_inserter<std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>
                       ((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         *)aArrName_local);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::function
            (&local_a0,aPred);
  std::
  copy_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::back_insert_iterator<std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,std::function<bool(ot::commissioner::persistent_storage::Network_const&)>>
            (&local_58,&local_78,local_80,&local_a0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::~function(&local_a0);
  sVar2 = std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::size((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  *)aArrName_local);
  return sVar2 <= local_38;
}

Assistant:

Status LookupPred(std::function<bool(V const &)> aPred, std::vector<V> &aRet, std::string aArrName)
    {
        size_t prevSize = aRet.size();
        std::copy_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]), std::back_inserter(aRet), aPred);

        if (aRet.size() > prevSize)
        {
            return Status::kSuccess;
        }

        return Status::kNotFound;
    }